

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

rtosc_arg_t rtosc_argument(char *msg,uint idx)

{
  char *pcVar1;
  char type;
  byte type_00;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  uint8_t *arg_mem;
  rtosc_arg_t rVar7;
  
  type_00 = rtosc_type(msg,idx);
  uVar5 = 0;
  if ((type_00 - 0x53 < 0x22) && ((0x3846b8001U >> ((ulong)(type_00 - 0x53) & 0x3f) & 1) != 0)) {
    pcVar3 = rtosc_argument_string(msg);
    pcVar6 = pcVar3 + 4;
    lVar4 = 1;
    do {
      lVar4 = lVar4 + 1;
      pcVar1 = pcVar6 + -3;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar1 != '\0');
    for (; (*pcVar3 == '[' || (*pcVar3 == ']')); pcVar3 = pcVar3 + 1) {
    }
    arg_mem = (uint8_t *)(pcVar6 + -(lVar4 % 4));
    while (pcVar6 = pcVar3 + 1, idx != 0) {
      type = *pcVar3;
      pcVar3 = pcVar6;
      if ((type != ']') && (type != '[')) {
        idx = idx - 1;
        uVar2 = arg_size(arg_mem,type);
        arg_mem = arg_mem + uVar2;
      }
    }
    uVar5 = (ulong)(uint)((int)arg_mem - (int)msg);
  }
  rVar7 = extract_arg(msg + uVar5,type_00);
  return rVar7;
}

Assistant:

rtosc_arg_t rtosc_argument(const char *msg, unsigned idx)
{
    char type = rtosc_type(msg, idx);
    uint8_t *arg_mem = (uint8_t*)msg + arg_off(msg, idx);
    return extract_arg(arg_mem, type);
}